

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
::rebalance_right_to_left
          (btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
           *this,field_type to_move,
          btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  field_type fVar6;
  field_type fVar7;
  btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar8;
  btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar9;
  template_ElementType<2UL> *ptVar10;
  
  pbVar8 = parent(this);
  pbVar9 = parent(right);
  if (pbVar8 != pbVar9) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x738,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>]"
                 );
  }
  bVar2 = position(this);
  bVar3 = position(right);
  if (bVar2 + 1 != (uint)bVar3) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x739,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>]"
                 );
  }
  bVar2 = count(right);
  bVar3 = count(this);
  if (bVar2 < bVar3) {
    __assert_fail("right->count() >= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x73a,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>]"
                 );
  }
  if (to_move != '\0') {
    bVar2 = count(right);
    if (bVar2 < to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x73c,
                    "void absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>]"
                   );
    }
    bVar2 = finish(this);
    bVar3 = position(this);
    pbVar8 = parent(this);
    transfer(this,(ulong)bVar2,(ulong)bVar3,pbVar8,alloc);
    bVar2 = finish(this);
    bVar3 = start(right);
    transfer_n(this,(ulong)(to_move - 1),(ulong)bVar2 + 1,(ulong)bVar3,right,alloc);
    pbVar8 = parent(this);
    bVar2 = position(this);
    bVar3 = start(right);
    transfer(pbVar8,(ulong)bVar2,(ulong)(((uint)to_move + (uint)bVar3) - 1),right,alloc);
    bVar2 = count(right);
    bVar3 = start(right);
    bVar4 = start(right);
    transfer_n(right,(long)(int)((uint)bVar2 - (uint)to_move),(ulong)bVar3,
               (ulong)((uint)bVar4 + (uint)to_move),right,alloc);
    bVar5 = is_internal(this);
    if (bVar5) {
      fVar7 = '\0';
      while (to_move != fVar7) {
        fVar6 = finish(this);
        pbVar8 = child(right,fVar7);
        init_child(this,fVar6 + fVar7 + '\x01',pbVar8);
        fVar7 = fVar7 + '\x01';
      }
      bVar2 = start(right);
      while( true ) {
        bVar3 = finish(right);
        if ((int)((uint)bVar3 - (uint)to_move) < (int)(uint)bVar2) break;
        uVar1 = (uint)bVar2 + (uint)to_move;
        bVar3 = max_count(right);
        if (bVar3 < uVar1) {
          __assert_fail("i + to_move <= right->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                        ,0x751,
                        "void absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>]"
                       );
        }
        pbVar8 = child(right,(field_type)uVar1);
        init_child(right,bVar2,pbVar8);
        btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
        ::GetField<4ul>((btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
                         *)right);
        bVar2 = bVar2 + 1;
      }
    }
    fVar7 = finish(this);
    ptVar10 = btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
              ::GetField<2ul>((btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
                               *)this);
    ptVar10[2] = fVar7 + to_move;
    fVar7 = finish(right);
    ptVar10 = btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
              ::GetField<2ul>((btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
                               *)right);
    ptVar10[2] = fVar7 - to_move;
    return;
  }
  __assert_fail("to_move >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                ,0x73b,
                "void absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_right_to_left(field_type to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  transfer(finish(), position(), parent(), alloc);

  // 2) Move the (to_move - 1) values from the right node to the left node.
  transfer_n(to_move - 1, finish() + 1, right->start(), right, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  parent()->transfer(position(), right->start() + to_move - 1, right, alloc);

  // 4) Shift the values in the right node to their correct positions.
  right->transfer_n(right->count() - to_move, right->start(),
                    right->start() + to_move, right, alloc);

  if (is_internal()) {
    // Move the child pointers from the right to the left node.
    for (field_type i = 0; i < to_move; ++i) {
      init_child(finish() + i + 1, right->child(i));
    }
    for (field_type i = right->start(); i <= right->finish() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup `finish` on the left and right nodes.
  set_finish(finish() + to_move);
  right->set_finish(right->finish() - to_move);
}